

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O0

void csguide_webserver::Epoll::HandleConnection(ServerSocket *server_socket)

{
  int iVar1;
  int iVar2;
  ClientSocket *pCVar3;
  ostream *this;
  element_type *peVar4;
  element_type *peVar5;
  shared_ptr<csguide_webserver::HttpData> *in_RDI;
  shared_ptr<csguide_webserver::ClientSocket> sharedClientSocket;
  shared_ptr<csguide_webserver::HttpData> sharedHttpData;
  int ret;
  shared_ptr<csguide_webserver::ClientSocket> tempClient;
  HttpResponse *in_stack_fffffffffffffeb8;
  HttpData *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  HttpRequest *in_stack_fffffffffffffed0;
  undefined1 *in_stack_fffffffffffffed8;
  undefined1 mkeep;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  undefined4 in_stack_ffffffffffffff30;
  shared_ptr<csguide_webserver::HttpData> *httpData;
  undefined4 in_stack_ffffffffffffff40;
  undefined1 local_b0 [70];
  undefined1 local_6a;
  allocator local_69;
  string local_68 [48];
  undefined1 local_38 [16];
  int local_28;
  shared_ptr<csguide_webserver::HttpData> *local_8;
  
  local_8 = in_RDI;
  pCVar3 = (ClientSocket *)operator_new(0x18);
  ClientSocket::ClientSocket(pCVar3);
  std::shared_ptr<csguide_webserver::ClientSocket>::shared_ptr<csguide_webserver::ClientSocket,void>
            ((shared_ptr<csguide_webserver::ClientSocket> *)in_stack_fffffffffffffec0,
             (ClientSocket *)in_stack_fffffffffffffeb8);
  while( true ) {
    httpData = local_8;
    std::
    __shared_ptr_access<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)in_stack_fffffffffffffec0);
    iVar1 = ServerSocket::Accept
                      ((ServerSocket *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
                       ,(ClientSocket *)in_stack_fffffffffffffec0);
    if (iVar1 < 1) break;
    std::
    __shared_ptr_access<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x11e786);
    iVar2 = SetNonBlocking((int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
    mkeep = (undefined1)((ulong)in_stack_fffffffffffffed8 >> 0x38);
    local_28 = iVar2;
    if (iVar2 < 0) {
      this = std::operator<<((ostream *)&std::cout,"setnonblocking error");
      iVar1 = 0x134120;
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      peVar4 = std::
               __shared_ptr_access<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x11e7e7);
      ClientSocket::close(peVar4,iVar1);
    }
    else {
      operator_new(0x58);
      HttpData::HttpData(in_stack_fffffffffffffec0);
      std::shared_ptr<csguide_webserver::HttpData>::shared_ptr<csguide_webserver::HttpData,void>
                ((shared_ptr<csguide_webserver::HttpData> *)in_stack_fffffffffffffec0,
                 (HttpData *)in_stack_fffffffffffffeb8);
      operator_new(0x68);
      local_6a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"",&local_69);
      HttpRequest::HttpRequest
                (in_stack_fffffffffffffed0,
                 (string *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 (HTTP_METHOD)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                 (HTTP_VERSION)in_stack_fffffffffffffec0);
      local_6a = 0;
      std::shared_ptr<csguide_webserver::HttpRequest>::
      shared_ptr<csguide_webserver::HttpRequest,void>
                ((shared_ptr<csguide_webserver::HttpRequest> *)in_stack_fffffffffffffec0,
                 (HttpRequest *)in_stack_fffffffffffffeb8);
      std::
      __shared_ptr_access<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x11e8f3);
      std::shared_ptr<csguide_webserver::HttpRequest>::operator=
                ((shared_ptr<csguide_webserver::HttpRequest> *)in_stack_fffffffffffffec0,
                 (shared_ptr<csguide_webserver::HttpRequest> *)in_stack_fffffffffffffeb8);
      std::shared_ptr<csguide_webserver::HttpRequest>::~shared_ptr
                ((shared_ptr<csguide_webserver::HttpRequest> *)0x11e916);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      operator_new(0xb8);
      HttpResponse::HttpResponse
                ((HttpResponse *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (bool)mkeep);
      std::shared_ptr<csguide_webserver::HttpResponse>::
      shared_ptr<csguide_webserver::HttpResponse,void>
                ((shared_ptr<csguide_webserver::HttpResponse> *)in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffeb8);
      std::
      __shared_ptr_access<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x11e973);
      std::shared_ptr<csguide_webserver::HttpResponse>::operator=
                ((shared_ptr<csguide_webserver::HttpResponse> *)in_stack_fffffffffffffec0,
                 (shared_ptr<csguide_webserver::HttpResponse> *)in_stack_fffffffffffffeb8);
      std::shared_ptr<csguide_webserver::HttpResponse>::~shared_ptr
                ((shared_ptr<csguide_webserver::HttpResponse> *)0x11e996);
      pCVar3 = (ClientSocket *)operator_new(0x18);
      ClientSocket::ClientSocket(pCVar3);
      std::shared_ptr<csguide_webserver::ClientSocket>::
      shared_ptr<csguide_webserver::ClientSocket,void>
                ((shared_ptr<csguide_webserver::ClientSocket> *)in_stack_fffffffffffffec0,
                 (ClientSocket *)in_stack_fffffffffffffeb8);
      in_stack_fffffffffffffed0 = (HttpRequest *)(local_b0 + 0x20);
      std::__shared_ptr<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2>::swap
                ((__shared_ptr<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2> *)
                 in_stack_fffffffffffffec0,
                 (__shared_ptr<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2> *)
                 in_stack_fffffffffffffeb8);
      in_stack_fffffffffffffed8 = local_38;
      std::
      __shared_ptr_access<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x11e9f3);
      std::shared_ptr<csguide_webserver::ClientSocket>::operator=
                ((shared_ptr<csguide_webserver::ClientSocket> *)in_stack_fffffffffffffec0,
                 (shared_ptr<csguide_webserver::ClientSocket> *)in_stack_fffffffffffffeb8);
      in_stack_fffffffffffffecc =
           *(int *)((long)&local_8[1].
                           super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + 4);
      peVar5 = std::
               __shared_ptr_access<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x11ea1d);
      peVar5->epoll_fd = in_stack_fffffffffffffecc;
      in_stack_fffffffffffffee0 =
           *(int *)((long)&local_8[1].
                           super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + 4);
      peVar4 = std::
               __shared_ptr_access<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x11ea3d);
      in_stack_fffffffffffffee4 = peVar4->fd_;
      std::shared_ptr<csguide_webserver::HttpData>::shared_ptr
                ((shared_ptr<csguide_webserver::HttpData> *)in_stack_fffffffffffffec0,
                 (shared_ptr<csguide_webserver::HttpData> *)in_stack_fffffffffffffeb8);
      Addfd(in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
            (__uint32_t)in_stack_fffffffffffffed8,
            (shared_ptr<csguide_webserver::HttpData> *)in_stack_fffffffffffffed0);
      std::shared_ptr<csguide_webserver::HttpData>::~shared_ptr
                ((shared_ptr<csguide_webserver::HttpData> *)0x11ea81);
      in_stack_fffffffffffffec0 = (HttpData *)local_b0;
      std::shared_ptr<csguide_webserver::HttpData>::shared_ptr
                ((shared_ptr<csguide_webserver::HttpData> *)in_stack_fffffffffffffec0,
                 (shared_ptr<csguide_webserver::HttpData> *)in_stack_fffffffffffffeb8);
      TimerManager::addTimer
                ((TimerManager *)CONCAT44(iVar1,in_stack_ffffffffffffff40),httpData,
                 CONCAT44(iVar2,in_stack_ffffffffffffff30));
      std::shared_ptr<csguide_webserver::HttpData>::~shared_ptr
                ((shared_ptr<csguide_webserver::HttpData> *)0x11eac5);
      std::shared_ptr<csguide_webserver::ClientSocket>::~shared_ptr
                ((shared_ptr<csguide_webserver::ClientSocket> *)0x11ead2);
      std::shared_ptr<csguide_webserver::HttpData>::~shared_ptr
                ((shared_ptr<csguide_webserver::HttpData> *)0x11eadf);
    }
  }
  std::shared_ptr<csguide_webserver::ClientSocket>::~shared_ptr
            ((shared_ptr<csguide_webserver::ClientSocket> *)0x11ec2c);
  return;
}

Assistant:

void Epoll::HandleConnection(const ServerSocket &server_socket) {
  std::shared_ptr<ClientSocket> tempClient(new ClientSocket);
  // epoll 是ET模式，循环接收连接
  // 需要将listen_fd设置为non-blocking

  while (server_socket.Accept(*tempClient) > 0) {
    // 设置非阻塞
    int ret = SetNonBlocking(tempClient->fd_);
    if (ret < 0) {
      std::cout << "setnonblocking error" << std::endl;
      tempClient->close();
      continue;
    }

    // FIXME 接受新客户端 构造HttpData并添加定时器

    // 在这里做限制并发, 暂时未完成

    std::shared_ptr<HttpData> sharedHttpData(new HttpData);
    sharedHttpData->request_ = std::shared_ptr<HttpRequest>(new HttpRequest());
    sharedHttpData->response_ = std::shared_ptr<HttpResponse>(new HttpResponse());

    std::shared_ptr<ClientSocket> sharedClientSocket(new ClientSocket());
    sharedClientSocket.swap(tempClient);
    sharedHttpData->client_socket_ = sharedClientSocket;
    sharedHttpData->epoll_fd = server_socket.epoll_fd_;
    Addfd(server_socket.epoll_fd_, sharedClientSocket->fd_, DEFAULT_EVENTS, sharedHttpData);
    // FIXME 默认超时时间5 秒测试添加定时器
    timer_manager_.addTimer(sharedHttpData, TimerManager::DEFAULT_TIME_OUT);
  }
}